

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O0

FT_UInt pcf_cmap_char_index(FT_CMap pcfcmap,FT_UInt32 charcode)

{
  FT_Face pFVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  FT_UInt32 w;
  FT_UInt32 h;
  FT_UInt32 j;
  FT_UInt32 i;
  PCF_Enc enc;
  FT_UInt32 charcode_local;
  FT_CMap pcfcmap_local;
  
  pFVar1 = pcfcmap[1].charmap.face;
  uVar2 = (charcode >> 8) - (uint)*(ushort *)((long)&pFVar1->num_faces + 4);
  uVar3 = (charcode & 0xff) - (uint)(ushort)pFVar1->num_faces;
  uVar4 = ((uint)*(ushort *)((long)&pFVar1->num_faces + 2) - (uint)(ushort)pFVar1->num_faces) + 1;
  if ((uVar2 < ((uint)*(ushort *)((long)&pFVar1->num_faces + 6) -
               (uint)*(ushort *)((long)&pFVar1->num_faces + 4)) + 1) && (uVar3 < uVar4)) {
    pcfcmap_local._4_4_ = (uint)*(ushort *)(pFVar1->face_flags + (ulong)(uVar2 * uVar4 + uVar3) * 2)
    ;
  }
  else {
    pcfcmap_local._4_4_ = 0;
  }
  return pcfcmap_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  pcf_cmap_char_index( FT_CMap    pcfcmap,  /* PCF_CMap */
                       FT_UInt32  charcode )
  {
    PCF_Enc  enc = ( (PCF_CMap)pcfcmap )->enc;

    FT_UInt32  i = ( charcode >> 8   ) - enc->firstRow;
    FT_UInt32  j = ( charcode & 0xFF ) - enc->firstCol;
    FT_UInt32  h = enc->lastRow - enc->firstRow + 1;
    FT_UInt32  w = enc->lastCol - enc->firstCol + 1;


    /* wrapped around "negative" values are also rejected */
    if ( i >= h || j >= w )
      return 0;

    return (FT_UInt)enc->offset[i * w + j];
  }